

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem-graph.hxx
# Opt level: O2

void __thiscall lineage::ProblemGraph::ProblemGraph(ProblemGraph *this,Problem *problem)

{
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  *this_00;
  int iVar1;
  pointer pNVar2;
  ulong uVar3;
  runtime_error *this_01;
  ulong uVar4;
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  *pvVar5;
  pointer pvVar6;
  pointer pEVar7;
  ulong local_50;
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  *local_48;
  Graph<andres::graph::IdleGraphVisitor<unsigned_long>_> *local_40;
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  *local_38;
  
  this->problem_ = problem;
  local_40 = &this->graph_;
  (this->graph_).vertices_.
  super__Vector_base<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>,_std::allocator<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->graph_).vertices_.
  super__Vector_base<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>,_std::allocator<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->graph_).vertices_.
  super__Vector_base<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>,_std::allocator<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->graph_).edges_.
  super__Vector_base<andres::graph::detail::Edge<false,_unsigned_long>,_std::allocator<andres::graph::detail::Edge<false,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->graph_).edges_.
  super__Vector_base<andres::graph::detail::Edge<false,_unsigned_long>,_std::allocator<andres::graph::detail::Edge<false,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->graph_).edges_.
  super__Vector_base<andres::graph::detail::Edge<false,_unsigned_long>,_std::allocator<andres::graph::detail::Edge<false,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->graph_).multipleEdgesEnabled_ = false;
  local_48 = &this->edgeIndicesFromFrame_;
  local_38 = &this->edgeIndicesInFrame_;
  this_00 = &this->nodeIndicesInFrame_;
  (this->edgeIndicesFromFrame_).
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->edgeIndicesFromFrame_).
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->edgeIndicesFromFrame_).
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->edgeIndicesInFrame_).
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->edgeIndicesInFrame_).
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->edgeIndicesInFrame_).
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->nodeIndicesInFrame_).
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->nodeIndicesInFrame_).
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->nodeIndicesInFrame_).
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  uVar4 = 0;
  while( true ) {
    pNVar2 = (problem->nodes).super__Vector_base<lineage::Node,_std::allocator<lineage::Node>_>.
             _M_impl.super__Vector_impl_data._M_start;
    uVar3 = ((long)(problem->nodes).
                   super__Vector_base<lineage::Node,_std::allocator<lineage::Node>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)pNVar2) / 0x18;
    local_50 = uVar4;
    if (uVar3 <= uVar4) break;
    uVar3 = (ulong)pNVar2[uVar4].t;
    pvVar6 = (this->nodeIndicesInFrame_).
             super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)(((long)(this->nodeIndicesInFrame_).
                       super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar6) / 0x18) <= uVar3)
    {
      std::
      vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
      ::resize(this_00,(long)(pNVar2[uVar4].t + 1));
      uVar3 = (ulong)pNVar2[uVar4].t;
      pvVar6 = (this_00->
               super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
    }
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back(pvVar6 + uVar3,&local_50);
    uVar4 = local_50 + 1;
  }
  this->numberOfFrames_ =
       ((long)(this->nodeIndicesInFrame_).
              super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
       (long)(this->nodeIndicesInFrame_).
             super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start) / 0x18;
  andres::graph::Graph<andres::graph::IdleGraphVisitor<unsigned_long>_>::insertVertices
            (local_40,uVar3);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::resize(local_38,this->numberOfFrames_);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::resize(local_48,this->numberOfFrames_ - 1);
  uVar4 = 0;
  do {
    pEVar7 = (problem->edges).super__Vector_base<lineage::Edge,_std::allocator<lineage::Edge>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)(((long)(problem->edges).
                       super__Vector_base<lineage::Edge,_std::allocator<lineage::Edge>_>._M_impl.
                       super__Vector_impl_data._M_finish - (long)pEVar7) / 0x18) <= uVar4) {
      return;
    }
    iVar1 = pEVar7[uVar4].t0;
    pvVar5 = local_38;
    local_50 = uVar4;
    if (iVar1 != pEVar7[uVar4].t1) {
      pvVar5 = local_48;
      if (iVar1 + 1 != pEVar7[uVar4].t1) {
        this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_01,"edge is not directed to next frame.");
        __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
    }
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              ((pvVar5->
               super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start + iVar1,&local_50);
    pEVar7 = pEVar7 + uVar4;
    pvVar6 = (this_00->
             super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    andres::graph::Graph<andres::graph::IdleGraphVisitor<unsigned_long>_>::insertEdge
              (local_40,*(size_t *)
                         (*(long *)&pvVar6[pEVar7->t0].
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data + (long)pEVar7->v0 * 8),
               *(size_t *)
                (*(long *)&pvVar6[pEVar7->t1].
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data + (long)pEVar7->v1 * 8));
    uVar4 = local_50 + 1;
  } while( true );
}

Assistant:

ProblemGraph(Problem const& problem)
      : problem_(problem)
    {
        for (size_t j = 0; j < problem.nodes.size(); ++j) {
            auto const& node = problem.nodes[j];
            if (node.t >= nodeIndicesInFrame_.size())
                nodeIndicesInFrame_.resize(node.t + 1);

            nodeIndicesInFrame_[node.t].push_back(j);
        }

        numberOfFrames_ = nodeIndicesInFrame_.size();

        graph_.insertVertices(problem.nodes.size());

        edgeIndicesInFrame_.resize(numberOfFrames_);
        edgeIndicesFromFrame_.resize(numberOfFrames_ - 1);

        for (size_t j = 0; j < problem.edges.size(); ++j) {
            auto const& edge = problem.edges[j];

            if (edge.t0 == edge.t1)
                edgeIndicesInFrame_[edge.t0].push_back(j);
            else {
                if (edge.t0 + 1 != edge.t1)
                    throw std::runtime_error(
                        "edge is not directed to next frame.");

                edgeIndicesFromFrame_[edge.t0].push_back(j);
            }

            graph_.insertEdge(nodeIndicesInFrame_[edge.t0][edge.v0],
                              nodeIndicesInFrame_[edge.t1][edge.v1]);
        }
    }